

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O3

void __thiscall value_precede::value_precede(value_precede *this,int _s,int _t,vec<IntVar_*> *vs)

{
  vec<IntVar_*> *this_00;
  Tint *pTVar1;
  Tchar *pTVar2;
  uint uVar3;
  Tint *pTVar4;
  int iVar5;
  IntVar **ppIVar6;
  int iVar7;
  int iVar8;
  IntVar *pIVar9;
  int *pt_2;
  ulong uVar10;
  int *pt;
  uint uVar11;
  IntVar *x;
  int local_54;
  TrailElem local_50;
  Tint *local_40;
  Tint *local_38;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020be88;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_50.pt = (int *)this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_50);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__value_precede_0020cca8;
  *(int *)&(this->super_Propagator).field_0x14 = _s;
  this->t = _t;
  (this->xs).sz = 0;
  (this->xs).cap = 0;
  (this->xs).data = (IntVar **)0x0;
  (this->satisfied).v = '\0';
  uVar10 = 0;
  if (vs->sz != 0) {
    ppIVar6 = vs->data;
    uVar10 = 0;
    do {
      pIVar9 = ppIVar6[uVar10];
      iVar5 = this->t;
      iVar8 = (pIVar9->min).v;
      iVar7 = (pIVar9->max).v;
      if ((iVar5 <= iVar7 && iVar8 <= iVar5) &&
         ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[iVar5].v != '\0')))) {
        int_rel(pIVar9,IRT_NE,iVar5);
        ppIVar6 = vs->data;
        _s = *(int *)&(this->super_Propagator).field_0x14;
        pIVar9 = ppIVar6[uVar10];
        iVar8 = (pIVar9->min).v;
        iVar7 = (pIVar9->max).v;
      }
    } while ((((_s < iVar8) || (iVar7 < _s)) ||
             ((pIVar9->vals != (Tchar *)0x0 && (pIVar9->vals[_s].v == '\0')))) &&
            (uVar10 = uVar10 + 1, uVar10 < vs->sz));
  }
  local_54 = 0;
  this_00 = &this->xs;
  pTVar1 = &this->first_s;
  local_50.x = pTVar1->v;
  local_50.sz = 4;
  local_50.pt = &pTVar1->v;
  vec<TrailElem>::push(&engine.trail,&local_50);
  pTVar1->v = 0;
  uVar11 = vs->sz;
  if ((uint)uVar10 < uVar11) {
    uVar10 = uVar10 & 0xffffffff;
    do {
      local_50.pt = (int *)vs->data[uVar10];
      iVar5 = (((IntVar *)local_50.pt)->min).v;
      iVar8 = (((IntVar *)local_50.pt)->max).v;
      iVar7 = *(int *)&(this->super_Propagator).field_0x14;
      if (iVar5 == iVar7 && iVar5 == iVar8) break;
      if ((iVar8 < iVar7 || iVar7 < iVar5) ||
         ((((IntVar *)local_50.pt)->vals != (Tchar *)0x0 &&
          (((IntVar *)local_50.pt)->vals[iVar7].v == '\0')))) {
        iVar7 = this->t;
        if ((iVar7 <= iVar8 && iVar5 <= iVar7) &&
           ((((IntVar *)local_50.pt)->vals == (Tchar *)0x0 ||
            (((IntVar *)local_50.pt)->vals[iVar7].v != '\0')))) goto LAB_0016ed71;
      }
      else {
LAB_0016ed71:
        vec<IntVar_*>::push(this_00,(IntVar **)&local_50);
        iVar5 = ((Tint *)((long)local_50.pt + 0xc))->v;
        if ((iVar5 == ((Tint *)((long)local_50.pt + 0x10))->v) && (iVar5 == this->t)) {
          local_54 = -1;
          goto LAB_0016edb1;
        }
        uVar11 = vs->sz;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar11);
    local_54 = 0;
  }
LAB_0016edb1:
  pTVar2 = &this->satisfied;
  if (1 < this_00->sz) {
    local_38 = &this->second_s;
    local_40 = &this->first_t;
    uVar11 = 1;
    uVar10 = 0;
    do {
      pIVar9 = (this->xs).data[uVar10];
      IntVar::specialiseToEL(pIVar9);
      iVar5 = *(int *)&(this->super_Propagator).field_0x14;
      iVar8 = (pIVar9->min).v;
      iVar7 = (pIVar9->max).v;
      if ((iVar5 <= iVar7 && iVar8 <= iVar5) &&
         ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[iVar5].v != '\0')))) {
        (*(pIVar9->super_Var).super_Branching._vptr_Branching[7])(pIVar9,this,(ulong)(uVar11 - 1),1)
        ;
        iVar8 = (pIVar9->min).v;
        iVar7 = (pIVar9->max).v;
      }
      iVar5 = this->t;
      if (((iVar8 <= iVar5) && (iVar5 <= iVar7)) &&
         ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[iVar5].v != '\0')))) {
        (*(pIVar9->super_Var).super_Branching._vptr_Branching[7])(pIVar9,this,(ulong)uVar11,8);
      }
      pTVar1 = local_40;
      uVar10 = uVar10 + 1;
      uVar3 = this_00->sz;
      uVar11 = uVar11 + 2;
    } while (uVar10 < uVar3);
    local_50.pt = &local_40->v;
    local_50.x = local_40->v;
    local_50.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_50);
    pTVar4 = local_38;
    pTVar1->v = uVar3 + local_54;
    uVar11 = this_00->sz;
    uVar10 = 1;
    if (1 < (int)uVar11) {
      iVar5 = *(int *)&(this->super_Propagator).field_0x14;
      uVar10 = 1;
      do {
        pIVar9 = (this->xs).data[uVar10];
        if ((((pIVar9->min).v <= iVar5) && (iVar5 <= (pIVar9->max).v)) &&
           ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[iVar5].v != '\0')))) goto LAB_0016eefe;
        uVar10 = uVar10 + 1;
      } while (uVar11 != uVar10);
      uVar10 = (ulong)uVar11;
    }
LAB_0016eefe:
    local_50.pt = &local_38->v;
    local_50.x = local_38->v;
    local_50.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_50);
    pTVar4->v = (int)uVar10;
    if ((int)uVar10 < pTVar1->v) {
      return;
    }
    pIVar9 = (this->xs).data[(uint)(this->first_s).v];
    iVar5 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0x10])
                      (pIVar9,(long)*(int *)&(this->super_Propagator).field_0x14,0,1);
    if ((char)iVar5 == '\0') {
      puts("=====UNSATISFIABLE=====");
      printf("%% Top level failure!\n");
      exit(0);
    }
  }
  local_50.x = (int)pTVar2->v;
  local_50.sz = 1;
  local_50.pt = (int *)pTVar2;
  vec<TrailElem>::push(&engine.trail,&local_50);
  pTVar2->v = '\x01';
  return;
}

Assistant:

value_precede(int _s, int _t, vec<IntVar*>& vs) : s(_s), t(_t), satisfied(0) {
		// Find the first possible occurrence of s.
		unsigned int ii = 0;
		// Can't do remVal before initialization.
		for (; ii < vs.size(); ii++) {
			if (vs[ii]->indomain(t)) {
				int_rel(vs[ii], IRT_NE, t);
			}
			if (vs[ii]->indomain(s)) {
				break;
			}
		}

		// Now copy the remaining values.
		bool t_seen = false;
		first_s = 0;
		for (; ii < vs.size(); ii++) {
			IntVar* x(vs[ii]);
			if (x->isFixed() && x->getVal() == s) {
				break;
			}

			if (!x->indomain(s) && !x->indomain(t)) {
				continue;
			}
			xs.push(x);

			if (x->isFixed() && x->getVal() == t) {
				t_seen = true;
				break;
			}
		}

		if (xs.size() <= 1) {
			satisfied = 1;
			return;
		}

		for (unsigned int ii = 0; ii < xs.size(); ii++) {
			IntVar* x(xs[ii]);
			x->specialiseToEL();
			if (x->indomain(s)) {
				x->attach(this, ii << 1, EVENT_C);
			}
			if (x->indomain(t)) {
				x->attach(this, (ii << 1) | 1, EVENT_F);
			}
		}

		first_t = xs.size() - static_cast<int>(t_seen);

		int si = 1;
		for (; si < static_cast<int>(xs.size()); ++si) {
			if (xs[si]->indomain(s)) {
				break;
			}
		}
		second_s = si;
		if (first_t <= second_s) {
			if (!xs[first_s]->setVal(s)) {
				TL_FAIL();
			}
			satisfied = 1;
		}
	}